

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O2

EncConfig * __thiscall QPDFJob::EncConfig::modify(EncConfig *this,string *parameter)

{
  element_type *peVar1;
  bool bVar2;
  allocator<char> local_31;
  string local_30;
  
  if (((this->config->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->keylen == 0x28) {
    bVar2 = std::operator==(parameter,"y");
    ((this->config->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    r2_modify = bVar2;
  }
  else {
    bVar2 = std::operator==(parameter,"all");
    if (bVar2) {
      peVar1 = (this->config->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      peVar1->r3_assemble = true;
      peVar1->r3_annotate_and_form = true;
      peVar1->r3_form_filling = true;
      peVar1->r3_modify_other = true;
    }
    else {
      bVar2 = std::operator==(parameter,"annotate");
      if (bVar2) {
        peVar1 = (this->config->o->m).
                 super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        peVar1->r3_assemble = true;
        peVar1->r3_annotate_and_form = true;
        peVar1->r3_form_filling = true;
        peVar1->r3_modify_other = false;
      }
      else {
        bVar2 = std::operator==(parameter,"form");
        if (bVar2) {
          peVar1 = (this->config->o->m).
                   super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          peVar1->r3_assemble = true;
          peVar1->r3_annotate_and_form = false;
          peVar1->r3_form_filling = true;
          peVar1->r3_modify_other = false;
        }
        else {
          bVar2 = std::operator==(parameter,"assembly");
          if (bVar2) {
            peVar1 = (this->config->o->m).
                     super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            peVar1->r3_assemble = true;
            peVar1->r3_annotate_and_form = false;
            peVar1->r3_form_filling = false;
            peVar1->r3_modify_other = false;
          }
          else {
            bVar2 = std::operator==(parameter,"none");
            if (bVar2) {
              peVar1 = (this->config->o->m).
                       super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              peVar1->r3_assemble = false;
              peVar1->r3_annotate_and_form = false;
              peVar1->r3_form_filling = false;
              peVar1->r3_modify_other = false;
            }
            else {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_30,"invalid modify option",&local_31);
              usage(&local_30);
              std::__cxx11::string::~string((string *)&local_30);
            }
          }
        }
      }
    }
  }
  return this;
}

Assistant:

QPDFJob::EncConfig*
QPDFJob::EncConfig::modify(std::string const& parameter)
{
    if (config->o.m->keylen == 40) {
        config->o.m->r2_modify = (parameter == "y");
    } else if (parameter == "all") {
        config->o.m->r3_assemble = true;
        config->o.m->r3_annotate_and_form = true;
        config->o.m->r3_form_filling = true;
        config->o.m->r3_modify_other = true;
    } else if (parameter == "annotate") {
        config->o.m->r3_assemble = true;
        config->o.m->r3_annotate_and_form = true;
        config->o.m->r3_form_filling = true;
        config->o.m->r3_modify_other = false;
    } else if (parameter == "form") {
        config->o.m->r3_assemble = true;
        config->o.m->r3_annotate_and_form = false;
        config->o.m->r3_form_filling = true;
        config->o.m->r3_modify_other = false;
    } else if (parameter == "assembly") {
        config->o.m->r3_assemble = true;
        config->o.m->r3_annotate_and_form = false;
        config->o.m->r3_form_filling = false;
        config->o.m->r3_modify_other = false;
    } else if (parameter == "none") {
        config->o.m->r3_assemble = false;
        config->o.m->r3_annotate_and_form = false;
        config->o.m->r3_form_filling = false;
        config->o.m->r3_modify_other = false;
    } else {
        usage("invalid modify option");
    }
    return this;
}